

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_value_function.cpp
# Opt level: O1

void __thiscall
duckdb::WindowNthValueExecutor::EvaluateInternal
          (WindowNthValueExecutor *this,WindowExecutorGlobalState *gstate,
          WindowExecutorLocalState *lstate,DataChunk *eval_chunk,Vector *result,idx_t count,
          idx_t row_idx)

{
  WindowExcludeMode WVar1;
  ulong uVar2;
  unsigned_long *puVar3;
  _func_int *p_Var4;
  _Head_base<0UL,_duckdb::WindowCursor_*,_false> _Var5;
  WindowCollection *r;
  type this_00;
  const_reference pvVar6;
  reference pvVar7;
  ulong uVar8;
  reference pvVar9;
  _func_int *p_Var10;
  idx_t row_idx_00;
  pointer this_01;
  int iVar11;
  ulong uVar12;
  WindowExecutorLocalState *pWVar13;
  size_type __n;
  ulong target_offset;
  iterator __end3;
  iterator __begin3;
  WindowCursor *pWVar14;
  ulong uVar15;
  pair<unsigned_long,_unsigned_long> pVar16;
  SubFrames *__range3;
  WindowInputExpression nth_col;
  _func_int *local_80;
  WindowInputExpression local_78;
  data_ptr_t local_60;
  idx_t local_58;
  data_ptr_t local_50;
  data_ptr_t local_48;
  data_ptr_t local_40;
  WindowExecutor *local_38;
  
  this_00 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
            operator*(&lstate[0x15].range_cursor);
  pWVar13 = lstate + 2;
  optional_ptr<duckdb::ValidityMask,_true>::CheckValid
            ((optional_ptr<duckdb::ValidityMask,_true> *)&gstate[2].executor);
  local_38 = gstate[2].executor;
  WVar1 = gstate->executor->wexpr->exclude_clause;
  WindowInputExpression::WindowInputExpression
            (&local_78,eval_chunk,(this->super_WindowValueExecutor).nth_idx);
  pvVar6 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)pWVar13,6);
  local_40 = pvVar6->data;
  pvVar6 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)pWVar13,7);
  local_48 = pvVar6->data;
  pvVar6 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)pWVar13,2);
  local_50 = pvVar6->data;
  pvVar6 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)pWVar13,3);
  if (count != 0) {
    pWVar13 = lstate + 0x14;
    local_60 = pvVar6->data;
    target_offset = 0;
    local_58 = count;
    do {
      uVar12 = *(ulong *)(local_40 + target_offset * 8);
      uVar2 = *(ulong *)(local_48 + target_offset * 8);
      if (WVar1 == NO_OTHER) {
        __n = 0;
      }
      else {
        uVar8 = row_idx;
        if (WVar1 != CURRENT_ROW) {
          uVar8 = *(ulong *)(local_50 + target_offset * 8);
        }
        if (uVar2 <= uVar8) {
          uVar8 = uVar2;
        }
        if (uVar8 <= uVar12) {
          uVar8 = uVar12;
        }
        pvVar7 = vector<duckdb::FrameBounds,_true>::operator[]
                           ((vector<duckdb::FrameBounds,_true> *)pWVar13,0);
        pvVar7->start = uVar12;
        pvVar7->end = uVar8;
        __n = 1;
        if (WVar1 == TIES) {
          uVar8 = uVar12;
          if (uVar12 < row_idx) {
            uVar8 = row_idx;
          }
          if (uVar2 <= uVar8) {
            uVar8 = uVar2;
          }
          uVar15 = row_idx + 1;
          if (uVar2 <= row_idx + 1) {
            uVar15 = uVar2;
          }
          if (uVar15 <= uVar12) {
            uVar15 = uVar12;
          }
          pvVar7 = vector<duckdb::FrameBounds,_true>::operator[]
                             ((vector<duckdb::FrameBounds,_true> *)pWVar13,1);
          pvVar7->start = uVar8;
          pvVar7->end = uVar15;
          __n = 2;
          count = local_58;
        }
        if (WVar1 == CURRENT_ROW) {
          uVar8 = row_idx + 1;
        }
        else {
          uVar8 = *(ulong *)(local_60 + target_offset * 8);
        }
        if (uVar12 < uVar8) {
          uVar12 = uVar8;
        }
        if (uVar2 <= uVar12) {
          uVar12 = uVar2;
        }
      }
      pvVar7 = vector<duckdb::FrameBounds,_true>::operator[]
                         ((vector<duckdb::FrameBounds,_true> *)pWVar13,__n);
      pvVar7->start = uVar12;
      pvVar7->end = uVar2;
      pvVar9 = vector<duckdb::Vector,_true>::operator[](&(local_78.chunk)->data,local_78.col_idx);
      puVar3 = (pvVar9->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (local_78.scalar == true) {
        if (puVar3 == (unsigned_long *)0x0) goto LAB_00cdf95c;
        uVar12 = (ulong)((uint)*puVar3 & 1);
LAB_00cdf953:
        if (uVar12 != 0) goto LAB_00cdf95c;
LAB_00cdfa48:
        FlatVector::SetNull(result,target_offset,true);
      }
      else {
        if (puVar3 != (unsigned_long *)0x0) {
          uVar12 = 1L << ((byte)target_offset & 0x3f) & puVar3[target_offset >> 6];
          goto LAB_00cdf953;
        }
LAB_00cdf95c:
        pvVar9 = vector<duckdb::Vector,_true>::operator[](&(local_78.chunk)->data,local_78.col_idx);
        uVar12 = target_offset;
        if (local_78.scalar != false) {
          uVar12 = 0;
        }
        p_Var4 = *(_func_int **)(pvVar9->data + uVar12 * 8);
        if ((long)p_Var4 < 1) goto LAB_00cdfa48;
        pWVar14 = (WindowCursor *)lstate[0x14].super_WindowExecutorState._vptr_WindowExecutorState;
        _Var5._M_head_impl =
             lstate[0x14].range_cursor.
             super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t
             .
             super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>
             .super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl;
        local_80 = p_Var4;
        if (gstate[2].partition_mask == (ValidityMask *)0x0) {
          for (; pWVar14 != _Var5._M_head_impl;
              pWVar14 = (WindowCursor *)
                        ((long)&(pWVar14->state).current_chunk_state.handles._M_h + 8)) {
            r = (WindowCollection *)(pWVar14->state).current_chunk_state.handles._M_h._M_buckets;
            iVar11 = 5;
            if (pWVar14->paged < r) {
              row_idx_00 = WindowBoundariesState::FindNextStart
                                     ((ValidityMask *)local_38,(idx_t)pWVar14->paged,(idx_t)r,
                                      (idx_t *)&local_80);
              iVar11 = 0;
              if (local_80 == (_func_int *)0x0) {
                WindowCursor::CopyCell(this_00,0,row_idx_00,result,target_offset);
                iVar11 = 1;
              }
            }
            if ((iVar11 != 5) && (iVar11 != 0)) goto LAB_00cdfa5a;
          }
          goto LAB_00cdfa48;
        }
        p_Var10 = (_func_int *)0x0;
        for (; pWVar14 != _Var5._M_head_impl;
            pWVar14 = (WindowCursor *)((long)&(pWVar14->state).current_chunk_state + 8)) {
          p_Var10 = p_Var10 + (*(long *)&(pWVar14->state).current_chunk_state.handles -
                              (long)pWVar14->paged);
        }
        if (p_Var10 <= p_Var4) goto LAB_00cdfa48;
        this_01 = unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
                  ::operator->((unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
                                *)&gstate[2].partition_mask);
        pVar16 = WindowIndexTree::SelectNth(this_01,(SubFrames *)pWVar13,(idx_t)(p_Var4 + -1));
        if (pVar16.second != 0) goto LAB_00cdfa48;
        WindowCursor::CopyCell(this_00,0,pVar16.first,result,target_offset);
      }
LAB_00cdfa5a:
      target_offset = target_offset + 1;
      row_idx = row_idx + 1;
    } while (target_offset != count);
  }
  return;
}

Assistant:

void WindowNthValueExecutor::EvaluateInternal(WindowExecutorGlobalState &gstate, WindowExecutorLocalState &lstate,
                                              DataChunk &eval_chunk, Vector &result, idx_t count, idx_t row_idx) const {
	auto &gvstate = gstate.Cast<WindowValueGlobalState>();
	auto &lvstate = lstate.Cast<WindowValueLocalState>();
	auto &cursor = *lvstate.cursor;
	auto &bounds = lvstate.bounds;
	auto &frames = lvstate.frames;
	auto &ignore_nulls = *gvstate.ignore_nulls;
	auto exclude_mode = gvstate.executor.wexpr.exclude_clause;
	D_ASSERT(cursor.chunk.ColumnCount() == 1);
	WindowInputExpression nth_col(eval_chunk, nth_idx);
	WindowAggregator::EvaluateSubFrames(bounds, exclude_mode, count, row_idx, frames, [&](idx_t i) {
		// Returns value evaluated at the row that is the n'th row of the window frame (counting from 1);
		// returns NULL if there is no such row.
		if (nth_col.CellIsNull(i)) {
			FlatVector::SetNull(result, i, true);
			return;
		}
		auto n_param = nth_col.GetCell<int64_t>(i);
		if (n_param < 1) {
			FlatVector::SetNull(result, i, true);
			return;
		}

		//	Decrement as we go along.
		auto n = idx_t(n_param);

		if (gvstate.value_tree) {
			idx_t frame_width = 0;
			for (const auto &frame : frames) {
				frame_width += frame.end - frame.start;
			}

			if (n < frame_width) {
				const auto nth_index = gvstate.value_tree->SelectNth(frames, n - 1);
				if (nth_index.second) {
					// Past end of frame
					FlatVector::SetNull(result, i, true);
				} else {
					cursor.CopyCell(0, nth_index.first, result, i);
				}
			} else {
				FlatVector::SetNull(result, i, true);
			}
			return;
		}

		for (const auto &frame : frames) {
			if (frame.start >= frame.end) {
				continue;
			}

			const auto nth_index = WindowBoundariesState::FindNextStart(ignore_nulls, frame.start, frame.end, n);
			if (!n) {
				cursor.CopyCell(0, nth_index, result, i);
				return;
			}
		}
		FlatVector::SetNull(result, i, true);
	});
}